

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::hufUnpackEncTable(char **pcode,int ni,int im,int iM,longlong *hcode)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  byte *pbVar10;
  uint uVar11;
  
  memset(hcode,0,0x80008);
  pbVar2 = (byte *)*pcode;
  bVar4 = iM < im;
  pbVar10 = pbVar2;
  if (iM < im) {
LAB_001259b7:
    *pcode = (char *)pbVar10;
    hufCanonicalCodeTable(hcode);
  }
  else if (-1 < ni) {
    iVar8 = iM + 1;
    uVar7 = 0;
    iVar9 = 0;
    do {
      iVar5 = iVar9;
      if (iVar9 < 6) {
        do {
          bVar1 = *pbVar10;
          pbVar10 = pbVar10 + 1;
          uVar7 = uVar7 << 8 | (ulong)bVar1;
          iVar5 = iVar9 + 8;
          bVar3 = iVar9 < -2;
          iVar9 = iVar5;
        } while (bVar3);
      }
      iVar9 = iVar5 + -6;
      uVar11 = (uint)((long)uVar7 >> ((byte)iVar9 & 0x3f)) & 0x3f;
      hcode[im] = (ulong)uVar11;
      if ((ulong)uVar11 == 0x3f) {
        if ((long)pbVar10 - (long)pbVar2 <= (long)ni) {
          if (iVar5 < 0xe) {
            iVar5 = iVar5 + -0xe;
            do {
              iVar9 = iVar5;
              bVar1 = *pbVar10;
              pbVar10 = pbVar10 + 1;
              uVar7 = (ulong)bVar1 | uVar7 << 8;
              iVar5 = iVar9 + 8;
            } while (iVar5 < 0);
            iVar9 = iVar9 + 0x10;
          }
          iVar9 = iVar9 + -8;
          uVar6 = (long)uVar7 >> ((byte)iVar9 & 0x3f);
          iVar5 = ((uint)uVar6 & 0xff) + im + 6;
          if (iVar5 <= iVar8) {
            uVar6 = uVar6 & 0xff;
            memset(hcode + im,0,uVar6 * 8 + 0x30);
            im = im + (int)uVar6 + 5;
          }
LAB_00125b38:
          if (iVar5 <= iVar8) goto LAB_00125b41;
        }
        bVar3 = false;
      }
      else {
        if (0x3a < uVar11) {
          iVar5 = uVar11 + im + -0x39;
          if (iVar5 <= iVar8) {
            if (uVar11 - 0x39 != 0) {
              memset(hcode + im,0,(ulong)(uVar11 - 0x39) << 3);
              im = im + uVar11 + -0x39;
            }
            im = im + -1;
          }
          goto LAB_00125b38;
        }
LAB_00125b41:
        bVar3 = true;
      }
      if (!bVar3) {
        return bVar4;
      }
      bVar4 = iM <= im;
      if (iM <= im) goto LAB_001259b7;
      im = im + 1;
    } while ((long)pbVar10 - (long)pbVar2 <= (long)ni);
  }
  return bVar4;
}

Assistant:

bool hufUnpackEncTable(const char **pcode,  // io: ptr to packed table (updated)
                       int ni,              // i : input size (in bytes)
                       int im,              // i : min hcode index
                       int iM,              // i : max hcode index
                       long long *hcode)    //  o: encoding table [HUF_ENCSIZE]
{
  memset(hcode, 0, sizeof(long long) * HUF_ENCSIZE);

  const char *p = *pcode;
  long long c = 0;
  int lc = 0;

  for (; im <= iM; im++) {
    if (p - *pcode > ni) {
      return false;
    }

    long long l = hcode[im] = getBits(6, c, lc, p);  // code length

    if (l == (long long)LONG_ZEROCODE_RUN) {
      if (p - *pcode > ni) {
        return false;
      }

      int zerun = getBits(8, c, lc, p) + SHORTEST_LONG_RUN;

      if (im + zerun > iM + 1) {
        return false;
      }

      while (zerun--) hcode[im++] = 0;

      im--;
    } else if (l >= (long long)SHORT_ZEROCODE_RUN) {
      int zerun = l - SHORT_ZEROCODE_RUN + 2;

      if (im + zerun > iM + 1) {
        return false;
      }

      while (zerun--) hcode[im++] = 0;

      im--;
    }
  }

  *pcode = const_cast<char *>(p);

  hufCanonicalCodeTable(hcode);

  return true;
}